

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O0

SRes LzmaProps_Decode(CLzmaProps *p,Byte *data,uint size)

{
  byte bVar1;
  uint local_28;
  Byte d;
  UInt32 dicSize;
  uint size_local;
  Byte *data_local;
  CLzmaProps *p_local;
  
  if (size < 5) {
    p_local._4_4_ = 4;
  }
  else {
    local_28 = *(uint *)(data + 1);
    if (local_28 < 0x1000) {
      local_28 = 0x1000;
    }
    p->dicSize = local_28;
    bVar1 = *data;
    if (bVar1 < 0xe1) {
      p->lc = bVar1 % 9;
      p->pb = (bVar1 / 9) / 5;
      p->lp = (bVar1 / 9) % 5;
      p_local._4_4_ = 0;
    }
    else {
      p_local._4_4_ = 4;
    }
  }
  return p_local._4_4_;
}

Assistant:

SRes LzmaProps_Decode(CLzmaProps *p, const Byte *data, unsigned size)
{
  UInt32 dicSize;
  Byte d;
  
  if (size < LZMA_PROPS_SIZE)
    return SZ_ERROR_UNSUPPORTED;
  else
    dicSize = data[1] | ((UInt32)data[2] << 8) | ((UInt32)data[3] << 16) | ((UInt32)data[4] << 24);
 
  if (dicSize < LZMA_DIC_MIN)
    dicSize = LZMA_DIC_MIN;
  p->dicSize = dicSize;

  d = data[0];
  if (d >= (9 * 5 * 5))
    return SZ_ERROR_UNSUPPORTED;

  p->lc = (Byte)(d % 9);
  d /= 9;
  p->pb = (Byte)(d / 5);
  p->lp = (Byte)(d % 5);

  return SZ_OK;
}